

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O0

ValuedAction __thiscall despot::DESPOT::Search(DESPOT *this)

{
  DSPOMDP *pDVar1;
  Belief *pBVar2;
  double dVar3;
  int iVar4;
  size_type sVar5;
  VNode *pVVar6;
  log_ostream *plVar7;
  ostream *poVar8;
  ValuedAction VVar9;
  long local_138;
  RandomStreams local_d8;
  long local_b8;
  LookaheadUpperBound *ub;
  double dStack_a8;
  double local_a0;
  double dStack_98;
  double local_90;
  double dStack_88;
  double local_80;
  double dStack_78;
  int local_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  int local_60;
  int iStack_5c;
  int iStack_58;
  int iStack_54;
  undefined1 local_40 [8];
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  double start;
  DESPOT *this_local;
  ValuedAction astar;
  
  iVar4 = logging::level();
  if (3 < iVar4) {
    pDVar1 = (this->super_Solver).model_;
    (*pDVar1->_vptr_DSPOMDP[0x14])(pDVar1,(this->super_Solver).belief_,&std::cout);
  }
  if (Globals::config <= 0.0) {
    iVar4 = (*((this->super_Solver).model_)->_vptr_DSPOMDP[5])();
    iVar4 = Random::NextInt((Random *)&Random::RANDOM,iVar4);
    ValuedAction::ValuedAction((ValuedAction *)&this_local,iVar4,-INFINITY);
  }
  else {
    particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)get_time_second();
    pBVar2 = (this->super_Solver).belief_;
    (*pBVar2->_vptr_Belief[2])(local_40,pBVar2,(ulong)(uint)DAT_00278a6c);
    iVar4 = logging::level();
    if ((0 < iVar4) && (iVar4 = logging::level(), 2 < iVar4)) {
      plVar7 = logging::stream(3);
      poVar8 = std::operator<<(&plVar7->super_ostream,"[DESPOT::Search] Time for sampling ");
      sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_40);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,sVar5);
      poVar8 = std::operator<<(poVar8," particles: ");
      dVar3 = get_time_second();
      poVar8 = (ostream *)
               std::ostream::operator<<
                         (poVar8,dVar3 - (double)particles.
                                                 super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
      ;
      poVar8 = std::operator<<(poVar8,"s");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    SearchStatistics::SearchStatistics((SearchStatistics *)&ub);
    (this->statistics_).num_particles_before_search = local_60;
    (this->statistics_).num_particles_after_search = iStack_5c;
    (this->statistics_).num_trials = iStack_58;
    (this->statistics_).longest_trial_length = iStack_54;
    (this->statistics_).num_policy_nodes = local_70;
    (this->statistics_).num_tree_nodes = iStack_6c;
    (this->statistics_).num_expanded_nodes = iStack_68;
    (this->statistics_).num_tree_particles = iStack_64;
    (this->statistics_).time_backup = local_80;
    (this->statistics_).time_node_expansion = dStack_78;
    (this->statistics_).time_search = local_90;
    (this->statistics_).time_path = dStack_88;
    (this->statistics_).final_lb = local_a0;
    (this->statistics_).final_ub = dStack_98;
    (this->statistics_).initial_lb = (double)ub;
    (this->statistics_).initial_ub = dStack_a8;
    particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)get_time_second();
    if ((Search()::streams == '\0') && (iVar4 = __cxa_guard_acquire(&Search()::streams), iVar4 != 0)
       ) {
      RandomStreams::RandomStreams(&Search::streams,DAT_00278a6c,DAT_00278a70);
      __cxa_atexit(RandomStreams::~RandomStreams,&Search::streams,&__dso_handle);
      __cxa_guard_release(&Search()::streams);
    }
    if (this->upper_bound_ == (ScenarioUpperBound *)0x0) {
      local_138 = 0;
    }
    else {
      local_138 = __dynamic_cast(this->upper_bound_,&ScenarioUpperBound::typeinfo,
                                 &LookaheadUpperBound::typeinfo,0);
    }
    local_b8 = local_138;
    if (local_138 == 0) {
      RandomStreams::RandomStreams(&local_d8,DAT_00278a6c,DAT_00278a70);
      RandomStreams::operator=(&Search::streams,&local_d8);
      RandomStreams::~RandomStreams(&local_d8);
      (*this->lower_bound_->_vptr_ScenarioLowerBound[2])(this->lower_bound_,&Search::streams);
      (*this->upper_bound_->_vptr_ScenarioUpperBound[2])(this->upper_bound_,&Search::streams);
    }
    else if ((Search::initialized & 1U) == 0) {
      (*this->lower_bound_->_vptr_ScenarioLowerBound[2])(this->lower_bound_,&Search::streams);
      (*this->upper_bound_->_vptr_ScenarioUpperBound[2])(this->upper_bound_,&Search::streams);
      Search::initialized = true;
    }
    pVVar6 = ConstructTree((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_40,
                           &Search::streams,this->lower_bound_,this->upper_bound_,
                           (this->super_Solver).model_,&(this->super_Solver).history_,
                           Globals::config,&this->statistics_);
    this->root_ = pVVar6;
    iVar4 = logging::level();
    if ((0 < iVar4) && (iVar4 = logging::level(), 2 < iVar4)) {
      plVar7 = logging::stream(3);
      poVar8 = std::operator<<(&plVar7->super_ostream,
                               "[DESPOT::Search] Time for tree construction: ");
      dVar3 = get_time_second();
      poVar8 = (ostream *)
               std::ostream::operator<<
                         (poVar8,dVar3 - (double)particles.
                                                 super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
      ;
      poVar8 = std::operator<<(poVar8,"s");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)get_time_second();
    VNode::Free(this->root_,(this->super_Solver).model_);
    iVar4 = logging::level();
    if ((0 < iVar4) && (iVar4 = logging::level(), 2 < iVar4)) {
      plVar7 = logging::stream(3);
      poVar8 = std::operator<<(&plVar7->super_ostream,
                               "[DESPOT::Search] Time for freeing particles in search tree: ");
      dVar3 = get_time_second();
      poVar8 = (ostream *)
               std::ostream::operator<<
                         (poVar8,dVar3 - (double)particles.
                                                 super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
      ;
      poVar8 = std::operator<<(poVar8,"s");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    VVar9 = OptimalAction(this->root_);
    astar._0_8_ = VVar9.value;
    this_local._0_4_ = VVar9.action;
    particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)get_time_second();
    pVVar6 = this->root_;
    if (pVVar6 != (VNode *)0x0) {
      VNode::~VNode(pVVar6);
      operator_delete(pVVar6,0x98);
    }
    iVar4 = logging::level();
    if ((0 < iVar4) && (iVar4 = logging::level(), 2 < iVar4)) {
      plVar7 = logging::stream(3);
      poVar8 = std::operator<<(&plVar7->super_ostream,"[DESPOT::Search] Time for deleting tree: ");
      dVar3 = get_time_second();
      poVar8 = (ostream *)
               std::ostream::operator<<
                         (poVar8,dVar3 - (double)particles.
                                                 super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
      ;
      poVar8 = std::operator<<(poVar8,"s");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    iVar4 = logging::level();
    if ((0 < iVar4) && (iVar4 = logging::level(), 2 < iVar4)) {
      plVar7 = logging::stream(3);
      poVar8 = std::operator<<(&plVar7->super_ostream,"[DESPOT::Search] Search statistics:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      poVar8 = despot::operator<<(poVar8,&this->statistics_);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_40);
  }
  VVar9._4_4_ = 0;
  VVar9.action = (uint)this_local;
  VVar9.value = (double)astar._0_8_;
  return VVar9;
}

Assistant:

ValuedAction DESPOT::Search() {
	if (logging::level() >= logging::DEBUG) {
		model_->PrintBelief(*belief_);
	}

	if (Globals::config.time_per_move <= 0) // Return a random action if no time is allocated for planning
		return ValuedAction(Random::RANDOM.NextInt(model_->NumActions()),
			Globals::NEG_INFTY);

	double start = get_time_second();
	vector<State*> particles = belief_->Sample(Globals::config.num_scenarios);
	logi << "[DESPOT::Search] Time for sampling " << particles.size()
		<< " particles: " << (get_time_second() - start) << "s" << endl;

	statistics_ = SearchStatistics();

	start = get_time_second();
	static RandomStreams streams = RandomStreams(Globals::config.num_scenarios,
		Globals::config.search_depth);

	LookaheadUpperBound* ub = dynamic_cast<LookaheadUpperBound*>(upper_bound_);
	if (ub != NULL) { // Avoid using new streams for LookaheadUpperBound
		static bool initialized = false;
		if (!initialized ) {
			lower_bound_->Init(streams);
			upper_bound_->Init(streams);
			initialized = true;
		}
	} else {
		streams = RandomStreams(Globals::config.num_scenarios,
			Globals::config.search_depth);
		lower_bound_->Init(streams);
		upper_bound_->Init(streams);
	}

	root_ = ConstructTree(particles, streams, lower_bound_, upper_bound_,
		model_, history_, Globals::config.time_per_move, &statistics_);
	logi << "[DESPOT::Search] Time for tree construction: "
		<< (get_time_second() - start) << "s" << endl;

	start = get_time_second();
	root_->Free(*model_);
	logi << "[DESPOT::Search] Time for freeing particles in search tree: "
		<< (get_time_second() - start) << "s" << endl;

	ValuedAction astar = OptimalAction(root_);
	start = get_time_second();
	delete root_;

	logi << "[DESPOT::Search] Time for deleting tree: "
		<< (get_time_second() - start) << "s" << endl;
	logi << "[DESPOT::Search] Search statistics:" << endl << statistics_
		<< endl;

	return astar;
}